

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmBitImEa<(moira::Instr)32,(moira::Mode)2,(moira::Size)1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  byte *pbVar3;
  char cVar4;
  uint uVar5;
  char *pcVar6;
  long lVar7;
  
  *addr = *addr + 2;
  uVar5 = (*this->_vptr_Moira[5])();
  pcVar6 = "bset";
  if (str->upper != false) {
    pcVar6 = "BSET";
  }
  cVar4 = *pcVar6;
  while (cVar4 != '\0') {
    pcVar6 = pcVar6 + 1;
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = cVar4;
    cVar4 = *pcVar6;
  }
  iVar1 = (this->tab).raw;
  while (pcVar6 = str->ptr, pcVar6 < str->base + iVar1) {
    str->ptr = pcVar6 + 1;
    *pcVar6 = ' ';
  }
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = '#';
  StrWriter::operator<<(str,(UInt)(uVar5 & 0xff));
  cVar4 = ',';
  lVar7 = 0;
  do {
    pcVar6 = str->ptr;
    str->ptr = pcVar6 + 1;
    *pcVar6 = cVar4;
    cVar4 = "), "[lVar7 + 2];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 2);
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = '(';
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = 'A';
  pbVar3 = (byte *)str->ptr;
  str->ptr = (char *)(pbVar3 + 1);
  *pbVar3 = (byte)op & 7 | 0x30;
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = ')';
  return;
}

Assistant:

void
Moira::dasmBitImEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = dasmRead<S>(addr);
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << tab << "#" << UInt(src) << ", " << dst;
}